

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

int __thiscall Omega_h::Comm::dup(Comm *this,int __fd)

{
  ulong *puVar1;
  Library *this_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  bool sends_to_self;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  this_00 = (Library *)operator_new(0x50);
  if (puVar3[2] == 0) {
    sends_to_self = false;
  }
  else {
    puVar1 = (ulong *)puVar3[1];
    if (((ulong)puVar1 & 1) == 0) {
      uVar2 = *puVar1;
    }
    else {
      uVar2 = (ulong)puVar1 >> 3;
    }
    sends_to_self = (uVar2 & 0x3fffffffc) == 4;
  }
  Comm((Comm *)this_00,(Library *)*puVar3,puVar3[2] != 0,sends_to_self);
  this->library_ = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::Comm*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->srcs_,(Comm *)this_00);
  return (int)this;
}

Assistant:

CommPtr Comm::dup() const {
#ifdef OMEGA_H_USE_MPI
  MPI_Comm impl2;
  CALL(MPI_Comm_dup(impl_, &impl2));
  return CommPtr(new Comm(library_, impl2));
#else
  return CommPtr(
      new Comm(library_, srcs_.exists(), srcs_.exists() && srcs_.size() == 1));
#endif
}